

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

CellConfigRuleSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CellConfigRuleSyntax,slang::parsing::Token,slang::syntax::ConfigCellIdentifierSyntax&,slang::syntax::ConfigRuleClauseSyntax&,slang::parsing::Token>
          (BumpAllocator *this,Token *args,ConfigCellIdentifierSyntax *args_1,
          ConfigRuleClauseSyntax *args_2,Token *args_3)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  CellConfigRuleSyntax *pCVar11;
  
  pCVar11 = (CellConfigRuleSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CellConfigRuleSyntax *)this->endPtr < pCVar11 + 1) {
    pCVar11 = (CellConfigRuleSyntax *)allocateSlow(this,0x48,8);
  }
  else {
    this->head->current = (byte *)(pCVar11 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar1 = args->info;
  TVar7 = args_3->kind;
  uVar8 = args_3->field_0x2;
  NVar9.raw = (args_3->numFlags).raw;
  uVar10 = args_3->rawLen;
  pIVar2 = args_3->info;
  (pCVar11->super_ConfigRuleSyntax).super_SyntaxNode.kind = CellConfigRule;
  (pCVar11->super_ConfigRuleSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pCVar11->super_ConfigRuleSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pCVar11->cell).kind = TVar3;
  (pCVar11->cell).field_0x2 = uVar4;
  (pCVar11->cell).numFlags = (NumericTokenFlags)NVar5.raw;
  (pCVar11->cell).rawLen = uVar6;
  (pCVar11->cell).info = pIVar1;
  (pCVar11->name).ptr = args_1;
  (pCVar11->ruleClause).ptr = args_2;
  (pCVar11->semi).kind = TVar7;
  (pCVar11->semi).field_0x2 = uVar8;
  (pCVar11->semi).numFlags = (NumericTokenFlags)NVar9.raw;
  (pCVar11->semi).rawLen = uVar10;
  (pCVar11->semi).info = pIVar2;
  (args_1->super_SyntaxNode).parent = (SyntaxNode *)pCVar11;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)pCVar11;
  return pCVar11;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }